

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

void __thiscall
Js::JavascriptPromiseResolveOrRejectFunction::JavascriptPromiseResolveOrRejectFunction
          (JavascriptPromiseResolveOrRejectFunction *this,DynamicType *type,
          FunctionInfo *functionInfo,JavascriptPromise *promise,bool isReject,
          JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyResolvedRecord)

{
  JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyResolvedRecord_local;
  bool isReject_local;
  JavascriptPromise *promise_local;
  FunctionInfo *functionInfo_local;
  DynamicType *type_local;
  JavascriptPromiseResolveOrRejectFunction *this_local;
  
  RuntimeFunction::RuntimeFunction(&this->super_RuntimeFunction,type,functionInfo);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01e39c78;
  Memory::WriteBarrierPtr<Js::JavascriptPromise>::WriteBarrierPtr(&this->promise,promise);
  this->isReject = isReject;
  Memory::WriteBarrierPtr<Js::JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper>::
  WriteBarrierPtr(&this->alreadyResolvedWrapper,alreadyResolvedRecord);
  return;
}

Assistant:

JavascriptPromiseResolveOrRejectFunction::JavascriptPromiseResolveOrRejectFunction(DynamicType* type, FunctionInfo* functionInfo, JavascriptPromise* promise, bool isReject, JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyResolvedRecord)
        : RuntimeFunction(type, functionInfo), promise(promise), isReject(isReject), alreadyResolvedWrapper(alreadyResolvedRecord)
    { }